

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void increase_morale_by_5_score_by_5(tgestate_t *state)

{
  byte bVar1;
  
  bVar1 = 0x6b;
  if (state->morale < 0x6b) {
    bVar1 = state->morale;
  }
  state->morale = bVar1 + 5;
  increase_score(state,'\x05');
  return;
}

Assistant:

void increase_morale(tgestate_t *state, uint8_t delta)
{
  int increased_morale;

  assert(state != NULL);
  assert(delta > 0);

  increased_morale = state->morale + delta;
  if (increased_morale >= morale_MAX)
    increased_morale = morale_MAX;

  assert(increased_morale >= morale_MIN);
  assert(increased_morale <= morale_MAX);

  state->morale = increased_morale;
}